

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

size_t varint_get_length(uint64_t v)

{
  size_t sVar1;
  
  sVar1 = 1;
  if ((0xfc < v) && (sVar1 = 3, 0xffff < v)) {
    sVar1 = (ulong)(v >> 0x20 != 0) * 4 + 5;
  }
  return sVar1;
}

Assistant:

size_t varint_get_length(uint64_t v)
{
    if (v <= VI_MAX_8)
        return sizeof(uint8_t);
    if (v <= VI_MAX_16)
        return sizeof(uint8_t) + sizeof(uint16_t);
    if (v <= VI_MAX_32)
        return sizeof(uint8_t) + sizeof(uint32_t);
    return sizeof(uint8_t) + sizeof(uint64_t);
}